

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_core_impl.hpp
# Opt level: O0

void __thiscall iutest::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  UnitTestImpl *this_local;
  
  TerminateImpl(this);
  TestResult::~TestResult(&this->m_ad_hoc_testresult);
  std::vector<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>::~vector
            (&this->m_testsuites);
  return;
}

Assistant:

~UnitTestImpl() { TerminateImpl(); }